

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void kratos::MergeWireAssignmentsVisitor::create_new_assignment
               (Generator *generator,
               vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               *stmts,Var *left,Var *right)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  shared_ptr<kratos::AssignStmt> new_stmt;
  
  if ((stmts->
      super__Vector_base<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (stmts->
      super__Vector_base<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_48,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &right->super_enable_shared_from_this<kratos::Var>);
    Var::assign((Var *)local_38,(shared_ptr<kratos::Var> *)left,
                (AssignmentType)(__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::AssignStmt,void>
              (local_58,(__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)local_38);
    Generator::add_stmt(generator,(shared_ptr<kratos::Stmt> *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    if (generator->debug == true) {
      psVar1 = (stmts->
               super__Vector_base<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (psVar3 = (stmts->
                    super__Vector_base<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1;
          psVar3 = psVar3 + 1) {
        peVar2 = (psVar3->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        std::
        vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
                  ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    *)&(((Stmt *)local_38)->super_IRNode).fn_name_ln,
                   (((Stmt *)local_38)->super_IRNode).fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (peVar2->super_Stmt).super_IRNode.fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&(peVar2->super_Stmt).super_IRNode.fn_name_ln.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ._M_impl + 8));
      }
      local_48._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/optimize.cc";
      local_48._8_4_ = 0x1e4;
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::pair<char_const*,int>>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)&(((Stmt *)local_38)->super_IRNode).fn_name_ln,
                 (pair<const_char_*,_int> *)local_48);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_stmt);
  }
  return;
}

Assistant:

void static create_new_assignment(Generator* generator,
                                      const std::vector<std::shared_ptr<AssignStmt>>& stmts,
                                      Var* const left, Var* const right) {
        if (stmts.empty()) return;
        auto new_stmt = left->assign(right->shared_from_this(), AssignmentType::Blocking);
        generator->add_stmt(new_stmt);
        if (generator->debug) {
            // merge all the statements
            for (auto const& stmt : stmts) {
                new_stmt->fn_name_ln.insert(new_stmt->fn_name_ln.end(), stmt->fn_name_ln.begin(),
                                            stmt->fn_name_ln.end());
            }
            new_stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }
    }